

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_BonusTiles_RedFives_Test::~TEST_WiningStateTest_BonusTiles_RedFives_Test
          (TEST_WiningStateTest_BonusTiles_RedFives_Test *this)

{
  TEST_WiningStateTest_BonusTiles_RedFives_Test *mem;
  TEST_WiningStateTest_BonusTiles_RedFives_Test *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_BonusTiles_RedFives_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles_RedFives)
{
	addPair(Tile::RedFiveOfBamboos);
	addSequence(Tile::FiveOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::FiveOfBamboos);

	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(5, r.bonus_tile_count);
	CHECK_EQUAL(6, r.doubling_factor);
}